

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_gfx_draw_mesh(rf_mesh mesh,rf_material material,rf_mat transform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  rf_mat left;
  rf_mat left_00;
  rf_mat right;
  rf_context *prVar17;
  rf_int i;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int in_stack_00000008;
  int in_stack_0000000c;
  long in_stack_00000040;
  uint in_stack_00000068;
  uint in_stack_00000078;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a8;
  int in_stack_000000ac;
  rf_mat mat_view;
  rf_mat mat_model_view;
  rf_mat mat_projection;
  rf_mat mat_mvp;
  rf_float16 buffer_3;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(in_stack_00000078);
  if (in_stack_00000098 != -1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(in_stack_00000078);
    local_1a8 = CONCAT44(mat_model_view.m2,mat_model_view.m1);
    uStack_1a0 = CONCAT44(mat_projection.m0,mat_model_view.m3);
    local_198 = CONCAT44(mat_model_view.m6,mat_model_view.m5);
    uStack_190 = CONCAT44(mat_projection.m4,mat_model_view.m7);
    local_188 = CONCAT44(mat_model_view.m10,mat_model_view.m9);
    uStack_180 = CONCAT44(mat_projection.m8,mat_model_view.m11);
    local_178 = CONCAT44(mat_model_view.m14,mat_model_view.m13);
    uStack_170 = CONCAT44(mat_projection.m12,mat_model_view.m15);
    (*(rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv)(in_stack_00000098,1,'\0',(float *)&local_1a8);
  }
  if (in_stack_000000a8 != -1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
              (in_stack_000000a8,(float)*(byte *)(mat_model_view._0_8_ + 0x18) / 255.0,
               (float)*(byte *)(mat_model_view._0_8_ + 0x19) / 255.0,
               (float)*(byte *)(mat_model_view._0_8_ + 0x1a) / 255.0,
               (float)*(byte *)(mat_model_view._0_8_ + 0x1b) / 255.0);
  }
  if (in_stack_000000ac != -1) {
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
              (in_stack_000000ac,(float)*(byte *)(mat_model_view._0_8_ + 0x38) / 255.0,
               (float)*(byte *)(mat_model_view._0_8_ + 0x39) / 255.0,
               (float)*(byte *)(mat_model_view._0_8_ + 0x3a) / 255.0,
               (float)*(byte *)(mat_model_view._0_8_ + 0x3b) / 255.0);
  }
  if (in_stack_0000009c != -1) {
    fVar1 = (rf__ctx->field_0).modelview.m0;
    fVar2 = (rf__ctx->field_0).modelview.m4;
    fVar3 = (rf__ctx->field_0).modelview.m8;
    fVar4 = (rf__ctx->field_0).modelview.m12;
    fVar5 = (rf__ctx->field_0).modelview.m1;
    fVar6 = (rf__ctx->field_0).modelview.m5;
    fVar7 = (rf__ctx->field_0).modelview.m9;
    fVar8 = (rf__ctx->field_0).modelview.m13;
    fVar9 = (rf__ctx->field_0).modelview.m2;
    fVar10 = (rf__ctx->field_0).modelview.m6;
    fVar11 = (rf__ctx->field_0).modelview.m10;
    fVar12 = (rf__ctx->field_0).modelview.m14;
    fVar13 = (rf__ctx->field_0).modelview.m3;
    fVar14 = (rf__ctx->field_0).modelview.m7;
    fVar15 = (rf__ctx->field_0).modelview.m11;
    fVar16 = (rf__ctx->field_0).modelview.m15;
    (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(in_stack_00000078);
    local_1a8 = CONCAT44(fVar5,fVar1);
    uStack_1a0 = CONCAT44(fVar13,fVar9);
    local_198 = CONCAT44(fVar6,fVar2);
    uStack_190 = CONCAT44(fVar14,fVar10);
    local_188 = CONCAT44(fVar7,fVar3);
    uStack_180 = CONCAT44(fVar15,fVar11);
    local_178 = CONCAT44(fVar8,fVar4);
    uStack_170 = CONCAT44(fVar16,fVar12);
    (*(rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv)(in_stack_0000009c,1,'\0',(float *)&local_1a8);
  }
  if (in_stack_000000a0 != -1) {
    fVar1 = (rf__ctx->field_0).projection.m0;
    fVar2 = (rf__ctx->field_0).projection.m4;
    fVar3 = (rf__ctx->field_0).projection.m8;
    fVar4 = (rf__ctx->field_0).projection.m12;
    fVar5 = (rf__ctx->field_0).projection.m1;
    fVar6 = (rf__ctx->field_0).projection.m5;
    fVar7 = (rf__ctx->field_0).projection.m9;
    fVar8 = (rf__ctx->field_0).projection.m13;
    fVar9 = (rf__ctx->field_0).projection.m2;
    fVar10 = (rf__ctx->field_0).projection.m6;
    fVar11 = (rf__ctx->field_0).projection.m10;
    fVar12 = (rf__ctx->field_0).projection.m14;
    fVar13 = (rf__ctx->field_0).projection.m3;
    fVar14 = (rf__ctx->field_0).projection.m7;
    fVar15 = (rf__ctx->field_0).projection.m11;
    fVar16 = (rf__ctx->field_0).projection.m15;
    (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(in_stack_00000078);
    local_1a8 = CONCAT44(fVar5,fVar1);
    uStack_1a0 = CONCAT44(fVar13,fVar9);
    local_198 = CONCAT44(fVar6,fVar2);
    uStack_190 = CONCAT44(fVar14,fVar10);
    local_188 = CONCAT44(fVar7,fVar3);
    uStack_180 = CONCAT44(fVar15,fVar11);
    local_178 = CONCAT44(fVar8,fVar4);
    uStack_170 = CONCAT44(fVar16,fVar12);
    (*(rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv)(in_stack_000000a0,1,'\0',(float *)&local_1a8);
  }
  local_1a8._0_4_ = (rf__ctx->field_0).modelview.m0;
  local_1a8._4_4_ = (rf__ctx->field_0).modelview.m4;
  uStack_1a0._0_4_ = (rf__ctx->field_0).modelview.m8;
  uStack_1a0._4_4_ = (rf__ctx->field_0).modelview.m12;
  local_198._0_4_ = (rf__ctx->field_0).modelview.m1;
  local_198._4_4_ = (rf__ctx->field_0).modelview.m5;
  uStack_190._0_4_ = (rf__ctx->field_0).modelview.m9;
  uStack_190._4_4_ = (rf__ctx->field_0).modelview.m13;
  local_188._0_4_ = (rf__ctx->field_0).modelview.m2;
  local_188._4_4_ = (rf__ctx->field_0).modelview.m6;
  uStack_180._0_4_ = (rf__ctx->field_0).modelview.m10;
  uStack_180._4_4_ = (rf__ctx->field_0).modelview.m14;
  local_178._0_4_ = (rf__ctx->field_0).modelview.m3;
  local_178._4_4_ = (rf__ctx->field_0).modelview.m7;
  uStack_170._0_4_ = (rf__ctx->field_0).modelview.m11;
  uStack_170._4_4_ = (rf__ctx->field_0).modelview.m15;
  local_128._0_4_ = (rf__ctx->field_0).projection.m0;
  local_128._4_4_ = (rf__ctx->field_0).projection.m4;
  uStack_120._0_4_ = (rf__ctx->field_0).projection.m8;
  uStack_120._4_4_ = (rf__ctx->field_0).projection.m12;
  local_118._0_4_ = (rf__ctx->field_0).projection.m1;
  local_118._4_4_ = (rf__ctx->field_0).projection.m5;
  uStack_110._0_4_ = (rf__ctx->field_0).projection.m9;
  uStack_110._4_4_ = (rf__ctx->field_0).projection.m13;
  local_108._0_4_ = (rf__ctx->field_0).projection.m2;
  local_108._4_4_ = (rf__ctx->field_0).projection.m6;
  uStack_100._0_4_ = (rf__ctx->field_0).projection.m10;
  uStack_100._4_4_ = (rf__ctx->field_0).projection.m14;
  local_f8._0_4_ = (rf__ctx->field_0).projection.m3;
  local_f8._4_4_ = (rf__ctx->field_0).projection.m7;
  uStack_f0._0_4_ = (rf__ctx->field_0).projection.m11;
  uStack_f0._4_4_ = (rf__ctx->field_0).projection.m15;
  rf_mat_mul((rf__ctx->field_0).transform,(rf__ctx->field_0).modelview);
  left.m4 = mat_model_view.m5;
  left.m0 = mat_model_view.m1;
  left.m12 = mat_model_view.m13;
  left.m8 = mat_model_view.m9;
  left.m5 = mat_model_view.m6;
  left.m1 = mat_model_view.m2;
  left.m13 = mat_model_view.m14;
  left.m9 = mat_model_view.m10;
  left.m6 = mat_model_view.m7;
  left.m2 = mat_model_view.m3;
  left.m14 = mat_model_view.m15;
  left.m10 = mat_model_view.m11;
  left.m7 = mat_projection.m4;
  left.m3 = mat_projection.m0;
  left.m15 = mat_projection.m12;
  left.m11 = mat_projection.m8;
  right.m8 = (float)(undefined4)uStack_a0;
  right.m12 = (float)uStack_a0._4_4_;
  right.m0 = (float)(undefined4)local_a8;
  right.m4 = (float)local_a8._4_4_;
  right.m1 = (float)(undefined4)local_98;
  right.m5 = (float)local_98._4_4_;
  right.m9 = (float)(undefined4)uStack_90;
  right.m13 = (float)uStack_90._4_4_;
  right.m2 = (float)(undefined4)local_88;
  right.m6 = (float)local_88._4_4_;
  right.m10 = (float)(undefined4)uStack_80;
  right.m14 = (float)uStack_80._4_4_;
  right.m3 = (float)(undefined4)local_78;
  right.m7 = (float)local_78._4_4_;
  right.m11 = (float)(undefined4)uStack_70;
  right.m15 = (float)uStack_70._4_4_;
  rf_mat_mul(left,right);
  lVar18 = 0;
  do {
    if (*(uint *)mat_model_view._0_8_ != 0) {
      uVar20 = (uint)lVar18;
      (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)(uVar20 + 0x84c0);
      uVar19 = 0xde1;
      if ((uVar20 & 0xe) == 8) {
        uVar19 = 0x8513;
      }
      if (lVar18 == 7) {
        uVar19 = 0x8513;
      }
      (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(uVar19,*(uint *)mat_model_view._0_8_);
      (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1i)(*(int *)(&stack0x000000b4 + lVar18 * 4),uVar20);
    }
    lVar18 = lVar18 + 1;
    mat_model_view._0_8_ = mat_model_view._0_8_ + 0x20;
  } while (lVar18 != 0xc);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(in_stack_00000068);
  prVar17 = rf__ctx;
  (prVar17->field_0).modelview.m3 = (float)(undefined4)local_138;
  (prVar17->field_0).modelview.m7 = (float)local_138._4_4_;
  (prVar17->field_0).modelview.m11 = (float)(undefined4)uStack_130;
  (prVar17->field_0).modelview.m15 = (float)uStack_130._4_4_;
  (prVar17->field_0).modelview.m2 = (float)(undefined4)local_148;
  (prVar17->field_0).modelview.m6 = (float)local_148._4_4_;
  (prVar17->field_0).modelview.m10 = (float)(undefined4)uStack_140;
  (prVar17->field_0).modelview.m14 = (float)uStack_140._4_4_;
  (prVar17->field_0).modelview.m1 = (float)(undefined4)local_158;
  (prVar17->field_0).modelview.m5 = (float)local_158._4_4_;
  (prVar17->field_0).modelview.m9 = (float)(undefined4)uStack_150;
  (prVar17->field_0).modelview.m13 = (float)uStack_150._4_4_;
  (prVar17->field_0).modelview.m0 = (float)(undefined4)local_168;
  (prVar17->field_0).modelview.m4 = (float)local_168._4_4_;
  (prVar17->field_0).modelview.m8 = (float)(undefined4)uStack_160;
  (prVar17->field_0).modelview.m12 = (float)uStack_160._4_4_;
  left_00.m8 = (float)(undefined4)uStack_160;
  left_00.m12 = (float)uStack_160._4_4_;
  left_00.m0 = (float)(undefined4)local_168;
  left_00.m4 = (float)local_168._4_4_;
  left_00.m1 = (float)(undefined4)local_158;
  left_00.m5 = (float)local_158._4_4_;
  left_00.m9 = (float)(undefined4)uStack_150;
  left_00.m13 = (float)uStack_150._4_4_;
  left_00.m2 = (float)(undefined4)local_148;
  left_00.m6 = (float)local_148._4_4_;
  left_00.m10 = (float)(undefined4)uStack_140;
  left_00.m14 = (float)uStack_140._4_4_;
  left_00.m3 = (float)(undefined4)local_138;
  left_00.m7 = (float)local_138._4_4_;
  left_00.m11 = (float)(undefined4)uStack_130;
  left_00.m15 = (float)uStack_130._4_4_;
  rf_mat_mul(left_00,(prVar17->field_0).projection);
  local_68 = local_e8;
  local_64 = local_d8;
  local_60 = local_c8;
  local_5c = local_b8;
  local_58 = local_e4;
  local_54 = local_d4;
  local_50 = local_c4;
  local_4c = local_b4;
  local_48 = local_e0;
  local_44 = local_d0;
  local_40 = local_c0;
  local_3c = local_b0;
  local_38 = local_dc;
  local_34 = local_cc;
  local_30 = local_bc;
  local_2c = local_ac;
  (*(prVar17->field_0).gfx_ctx.gl.UniformMatrix4fv)(in_stack_00000094,1,'\0',&local_68);
  if (in_stack_00000040 == 0) {
    (*(rf__ctx->field_0).gfx_ctx.gl.DrawArrays)(4,0,in_stack_00000008);
  }
  else {
    (*(rf__ctx->field_0).gfx_ctx.gl.DrawElements)(4,in_stack_0000000c * 3,0x1403,(void *)0x0);
  }
  lVar18 = 0;
  do {
    (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)((uint)lVar18 + 0x84c0);
    uVar20 = 0xde1;
    if (((uint)lVar18 & 0xe) == 8) {
      uVar20 = 0x8513;
    }
    if (lVar18 == 7) {
      uVar20 = 0x8513;
    }
    (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(uVar20,0);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0xc);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(0);
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(0);
  prVar17 = rf__ctx;
  (prVar17->field_0).projection.m3 = (float)(undefined4)local_f8;
  (prVar17->field_0).projection.m7 = (float)local_f8._4_4_;
  (prVar17->field_0).projection.m11 = (float)(undefined4)uStack_f0;
  (prVar17->field_0).projection.m15 = (float)uStack_f0._4_4_;
  (prVar17->field_0).projection.m2 = (float)(undefined4)local_108;
  (prVar17->field_0).projection.m6 = (float)local_108._4_4_;
  (prVar17->field_0).projection.m10 = (float)(undefined4)uStack_100;
  (prVar17->field_0).projection.m14 = (float)uStack_100._4_4_;
  (prVar17->field_0).projection.m1 = (float)(undefined4)local_118;
  (prVar17->field_0).projection.m5 = (float)local_118._4_4_;
  (prVar17->field_0).projection.m9 = (float)(undefined4)uStack_110;
  (prVar17->field_0).projection.m13 = (float)uStack_110._4_4_;
  (prVar17->field_0).projection.m0 = (float)(undefined4)local_128;
  (prVar17->field_0).projection.m4 = (float)local_128._4_4_;
  (prVar17->field_0).projection.m8 = (float)(undefined4)uStack_120;
  (prVar17->field_0).projection.m12 = (float)uStack_120._4_4_;
  (prVar17->field_0).modelview.m0 = (float)(undefined4)local_1a8;
  (prVar17->field_0).modelview.m4 = (float)local_1a8._4_4_;
  (prVar17->field_0).modelview.m8 = (float)(undefined4)uStack_1a0;
  (prVar17->field_0).modelview.m12 = (float)uStack_1a0._4_4_;
  (prVar17->field_0).modelview.m1 = (float)(undefined4)local_198;
  (prVar17->field_0).modelview.m5 = (float)local_198._4_4_;
  (prVar17->field_0).modelview.m9 = (float)(undefined4)uStack_190;
  (prVar17->field_0).modelview.m13 = (float)uStack_190._4_4_;
  (prVar17->field_0).modelview.m2 = (float)(undefined4)local_188;
  (prVar17->field_0).modelview.m6 = (float)local_188._4_4_;
  (prVar17->field_0).modelview.m10 = (float)(undefined4)uStack_180;
  (prVar17->field_0).modelview.m14 = (float)uStack_180._4_4_;
  (prVar17->field_0).modelview.m3 = (float)(undefined4)local_178;
  (prVar17->field_0).modelview.m7 = (float)local_178._4_4_;
  (prVar17->field_0).modelview.m11 = (float)(undefined4)uStack_170;
  (prVar17->field_0).modelview.m15 = (float)uStack_170._4_4_;
  return;
}

Assistant:

RF_API void rf_gfx_draw_mesh(rf_mesh mesh, rf_material material, rf_mat transform)
{
    // Bind shader program
    rf_gl.UseProgram(material.shader.id);

    // Matrices and other values required by shader
    //-----------------------------------------------------
    // Calculate and send to shader model matrix (used by PBR shader)
    if (material.shader.locs[RF_LOC_MATRIX_MODEL] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_MODEL], transform);

    // Upload to shader material.col_diffuse
    if (material.shader.locs[RF_LOC_COLOR_DIFFUSE] != -1)
        rf_gl.Uniform4f(material.shader.locs[RF_LOC_COLOR_DIFFUSE], (float)material.maps[RF_MAP_DIFFUSE].color.r / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.g / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.b / 255.0f,
                    (float)material.maps[RF_MAP_DIFFUSE].color.a / 255.0f);

    // Upload to shader material.colSpecular (if available)
    if (material.shader.locs[RF_LOC_COLOR_SPECULAR] != -1)
        rf_gl.Uniform4f(material.shader.locs[RF_LOC_COLOR_SPECULAR], (float)material.maps[RF_MAP_SPECULAR].color.r / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.g / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.b / 255.0f,
                    (float)material.maps[RF_MAP_SPECULAR].color.a / 255.0f);

    if (material.shader.locs[RF_LOC_MATRIX_VIEW] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_VIEW],
                                       rf_ctx.modelview);
    if (material.shader.locs[RF_LOC_MATRIX_PROJECTION] != -1)
        rf_gfx_set_shader_value_matrix(material.shader, material.shader.locs[RF_LOC_MATRIX_PROJECTION],
                                       rf_ctx.projection);

    // At this point the rf_ctx->gl_ctx.modelview matrix just contains the view matrix (camera)
    // That's because rf_begin_mode3d() sets it an no model-drawing function modifies it, all use rf_gfx_push_matrix() and rf_gfx_pop_matrix()
    rf_mat mat_view = rf_ctx.modelview;         // View matrix (camera)
    rf_mat mat_projection = rf_ctx.projection;  // Projection matrix (perspective)

    // TODO: Consider possible transform matrices in the rf_ctx->gl_ctx.stack
    // Is this the right order? or should we start with the first stored matrix instead of the last one?
    //rf_mat matStackTransform = rf_mat_identity();
    //for (rf_int i = rf_ctx->gl_ctx.stack_counter; i > 0; i--) matStackTransform = rf_mat_mul(rf_ctx->gl_ctx.stack[i], matStackTransform);

    // rf_transform to camera-space coordinates
    rf_mat mat_model_view = rf_mat_mul(transform, rf_mat_mul(rf_ctx.transform, mat_view));
    //-----------------------------------------------------

    // Bind active texture maps (if available)
    for (rf_int i = 0; i < RF_MAX_MATERIAL_MAPS; i++)
    {
        if (material.maps[i].texture.id > 0)
        {
            rf_gl.ActiveTexture(GL_TEXTURE0 + i);
            if ((i == RF_MAP_IRRADIANCE) || (i == RF_MAP_PREFILTER) || (i == RF_MAP_CUBEMAP)) rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, material.maps[i].texture.id);
            else rf_gl.BindTexture(GL_TEXTURE_2D, material.maps[i].texture.id);

            rf_gl.Uniform1i(material.shader.locs[RF_LOC_MAP_DIFFUSE + i], i);
        }
    }

    // Bind vertex array objects (or VBOs)
    rf_gl.BindVertexArray(mesh.vao_id);

    rf_ctx.modelview = mat_model_view;

    // Calculate model-view-rf_ctx->gl_ctx.projection matrix (MVP)
    rf_mat mat_mvp = rf_mat_mul(rf_ctx.modelview, rf_ctx.projection); // rf_transform to screen-space coordinates

    // Send combined model-view-rf_ctx->gl_ctx.projection matrix to shader
    rf_gl.UniformMatrix4fv(material.shader.locs[RF_LOC_MATRIX_MVP], 1, false, rf_mat_to_float16(mat_mvp).v);

    // Draw call!
    if (mesh.indices != NULL) rf_gl.DrawElements(GL_TRIANGLES, mesh.triangle_count * 3, GL_UNSIGNED_SHORT, 0); // Indexed vertices draw
    else rf_gl.DrawArrays(GL_TRIANGLES, 0, mesh.vertex_count);

    // Unbind all binded texture maps
    for (rf_int i = 0; i < RF_MAX_MATERIAL_MAPS; i++)
    {
        rf_gl.ActiveTexture(GL_TEXTURE0 + i);       // Set shader active texture
        if ((i == RF_MAP_IRRADIANCE) || (i == RF_MAP_PREFILTER) || (i == RF_MAP_CUBEMAP)) rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, 0);
        else rf_gl.BindTexture(GL_TEXTURE_2D, 0);   // Unbind current active texture
    }

    // Unind vertex array objects (or VBOs)
    rf_gl.BindVertexArray(0);

    // Unbind shader program
    rf_gl.UseProgram(0);

    // Restore rf_ctx->gl_ctx.projection/rf_ctx->gl_ctx.modelview matrices
    // NOTE: In stereo rendering matrices are being modified to fit every eye
    rf_ctx.projection = mat_projection;
    rf_ctx.modelview = mat_view;
}